

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderStructTests.cpp
# Opt level: O3

MovePtr<vkt::sr::(anonymous_namespace)::ShaderStructCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase>_>
* vkt::sr::anon_unknown_0::createStructCase
            (MovePtr<vkt::sr::(anonymous_namespace)::ShaderStructCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase>_>
             *__return_storage_ptr__,TestContext *testCtx,string *name,string *description,
            bool isVertexCase,ShaderEvalFunc evalFunc,UniformSetupFunc uniformFunc,
            LineStream *shaderSrc)

{
  int iVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  ShaderRenderCase *this;
  UniformSetup *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  allocator<char> local_111;
  key_type local_110;
  string local_f0;
  string fragSrc;
  string vertSrc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  spParams;
  StringTemplate local_50;
  
  if (sr::(anonymous_namespace)::
      createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
      ::defaultVertSrc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&sr::(anonymous_namespace)::
                                 createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                                 ::defaultVertSrc_abi_cxx11_);
    if (iVar1 != 0) {
      sr::(anonymous_namespace)::
      createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
      ::defaultVertSrc_abi_cxx11_._M_dataplus._M_p =
           (pointer)&sr::(anonymous_namespace)::
                     createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                     ::defaultVertSrc_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &sr::(anonymous_namespace)::
                  createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                  ::defaultVertSrc_abi_cxx11_,
                 "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_coords;\n\nvoid main (void)\n{\n\tv_coords = a_coords;\n\tgl_Position = a_position;\n}\n"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &sr::(anonymous_namespace)::
                    createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                    ::defaultVertSrc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&sr::(anonymous_namespace)::
                           createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                           ::defaultVertSrc_abi_cxx11_);
    }
  }
  if (sr::(anonymous_namespace)::
      createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
      ::defaultFragSrc_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&sr::(anonymous_namespace)::
                                 createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                                 ::defaultFragSrc_abi_cxx11_);
    if (iVar1 != 0) {
      sr::(anonymous_namespace)::
      createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
      ::defaultFragSrc_abi_cxx11_._M_dataplus._M_p =
           (pointer)&sr::(anonymous_namespace)::
                     createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                     ::defaultFragSrc_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &sr::(anonymous_namespace)::
                  createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                  ::defaultFragSrc_abi_cxx11_,
                 "#version 310 es\nlayout(location = 0) in mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n\to_color = v_color;\n}\n"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &sr::(anonymous_namespace)::
                    createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                    ::defaultFragSrc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&sr::(anonymous_namespace)::
                           createStructCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,void(*)(vkt::sr::ShaderEvalContext&),void(*)(vkt::sr::ShaderRenderCaseInstance&,tcu::Vector<float,int>const&),vkt::sr::LineStream_const&)
                           ::defaultFragSrc_abi_cxx11_);
    }
  }
  vertSrc._M_dataplus._M_p = (pointer)&vertSrc.field_2;
  vertSrc._M_string_length = 0;
  vertSrc.field_2._M_local_buf[0] = '\0';
  fragSrc._M_dataplus._M_p = (pointer)&fragSrc.field_2;
  fragSrc._M_string_length = 0;
  fragSrc.field_2._M_local_buf[0] = '\0';
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &spParams._M_t._M_impl.super__Rb_tree_header._M_header;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  spParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar4 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar4;
  spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       spParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (isVertexCase) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"HEADER","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xb24b81);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"COORDS","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xb200f3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"DST","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xb20183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"ASSIGN_POS","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xb24c20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = LineStream::str(shaderSrc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar3,&local_111);
    tcu::StringTemplate::StringTemplate(&local_50,&local_f0);
    tcu::StringTemplate::specialize(&local_110,&local_50,&spParams);
    std::__cxx11::string::operator=((string *)&vertSrc,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    tcu::StringTemplate::~StringTemplate(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&fragSrc);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"HEADER","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xb24c45);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"COORDS","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xb200fc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"DST","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xac52a4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"ASSIGN_POS","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&spParams,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xac52b7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&vertSrc);
    pcVar3 = LineStream::str(shaderSrc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar3,&local_111);
    tcu::StringTemplate::StringTemplate(&local_50,&local_f0);
    tcu::StringTemplate::specialize(&local_110,&local_50,&spParams);
    std::__cxx11::string::operator=((string *)&fragSrc,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar4) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    tcu::StringTemplate::~StringTemplate(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  this = (ShaderRenderCase *)operator_new(0xe0);
  this_00 = (UniformSetup *)operator_new(0x10);
  UniformSetup::UniformSetup(this_00,uniformFunc);
  ShaderRenderCase::ShaderRenderCase
            (this,testCtx,name,description,isVertexCase,evalFunc,this_00,(AttributeSetupFunc)0x0);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00d2cfd8;
  std::__cxx11::string::_M_assign((string *)&this->m_vertShaderSource);
  std::__cxx11::string::_M_assign((string *)&this->m_fragShaderSource);
  (__return_storage_ptr__->
  super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderStructCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase>_>
  ).m_data.ptr = (ShaderStructCase *)this;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&spParams._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fragSrc._M_dataplus._M_p != &fragSrc.field_2) {
    operator_delete(fragSrc._M_dataplus._M_p,
                    CONCAT71(fragSrc.field_2._M_allocated_capacity._1_7_,
                             fragSrc.field_2._M_local_buf[0]) + 1);
  }
  paVar4 = &vertSrc.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertSrc._M_dataplus._M_p != paVar4) {
    operator_delete(vertSrc._M_dataplus._M_p,
                    CONCAT71(vertSrc.field_2._M_allocated_capacity._1_7_,
                             vertSrc.field_2._M_local_buf[0]) + 1);
    paVar4 = extraout_RAX;
  }
  return (MovePtr<vkt::sr::(anonymous_namespace)::ShaderStructCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderStructCase>_>
          *)paVar4;
}

Assistant:

static de::MovePtr<ShaderStructCase> createStructCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, bool isVertexCase, ShaderEvalFunc evalFunc, UniformSetupFunc uniformFunc, const LineStream& shaderSrc)
{
	static std::string defaultVertSrc =
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"	v_coords = a_coords;\n"
		"	gl_Position = a_position;\n"
		"}\n";
	static std::string defaultFragSrc =
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"void main (void)\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n";

	// Fill in specialization parameters and build the shader source.
	std::string vertSrc;
	std::string fragSrc;
	std::map<std::string, std::string> spParams;

	if (isVertexCase)
	{
		spParams["HEADER"] =
			"#version 310 es\n"
			"layout(location = 0) in highp vec4 a_position;\n"
			"layout(location = 1) in highp vec4 a_coords;\n"
			"layout(location = 0) out mediump vec4 v_color;";
		spParams["COORDS"]		= "a_coords";
		spParams["DST"]			= "v_color";
		spParams["ASSIGN_POS"]	= "gl_Position = a_position;";

		vertSrc = tcu::StringTemplate(shaderSrc.str()).specialize(spParams);
		fragSrc = defaultFragSrc;
	}
	else
	{
		spParams["HEADER"]	=
			"#version 310 es\n"
			"layout(location = 0) in mediump vec4 v_coords;\n"
			"layout(location = 0) out mediump vec4 o_color;";
		spParams["COORDS"]			= "v_coords";
		spParams["DST"]				= "o_color";
		spParams["ASSIGN_POS"]		= "";

		vertSrc = defaultVertSrc;
		fragSrc = tcu::StringTemplate(shaderSrc.str()).specialize(spParams);
	}

	return de::MovePtr<ShaderStructCase>(new ShaderStructCase(testCtx, name, description, isVertexCase, evalFunc, uniformFunc, vertSrc, fragSrc));
}